

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int __thiscall
CLIntercept::ReadImage
          (CLIntercept *this,cl_command_queue commandQueue,cl_mem srcImage,cl_bool blockingRead,
          size_t *srcOrigin,size_t *region,size_t dstRowPitch,size_t dstSlicePitch,void *dstPtr,
          cl_uint numEventsInWaitList,cl_event *eventWaitList,cl_event *event)

{
  cl_icd_dispatch *pcVar1;
  void *pvVar2;
  cl_bool in_ECX;
  cl_mem in_RDX;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  cl_event *in_R8;
  size_t *in_R9;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  void *in_stack_00000018;
  void *mappedPointer;
  size_t dstOrigin [3];
  cl_mem dstImage;
  cl_image_format srcFormat;
  cl_context context;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffea8;
  lock_guard<std::mutex> *in_stack_fffffffffffffeb0;
  size_t local_98;
  size_t *in_stack_ffffffffffffff70;
  cl_mem in_stack_ffffffffffffff78;
  cl_mem in_stack_ffffffffffffff80;
  cl_mem commandQueue_00;
  cl_context in_stack_ffffffffffffff90;
  CLIntercept *in_stack_ffffffffffffff98;
  cl_context local_58;
  uint in_stack_ffffffffffffffb0;
  cl_int cVar3;
  size_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  cVar3 = 0;
  if ((in_R8 == (cl_event *)0x0) || (in_R9 == (size_t *)0x0)) {
    cVar3 = -0x1e;
  }
  local_58 = (cl_context)0x0;
  if (cVar3 == 0) {
    pcVar1 = dispatch(in_RDI);
    cVar3 = (*pcVar1->clGetCommandQueueInfo)(in_RSI,0x1090,8,&local_58,(size_t *)0x0);
  }
  memset(&stack0xffffffffffffff94,0,8);
  if (cVar3 == 0) {
    pcVar1 = dispatch(in_RDI);
    cVar3 = (*pcVar1->clGetImageInfo)(in_RDX,0x1110,8,&stack0xffffffffffffff94,(size_t *)0x0);
  }
  commandQueue_00 = (cl_mem)0x0;
  if (cVar3 == 0) {
    if (in_R9[2] == 1) {
      pcVar1 = dispatch(in_RDI);
      commandQueue_00 =
           (*pcVar1->clCreateImage2D)
                     (local_58,10,(cl_image_format *)&stack0xffffffffffffff94,*in_R9,in_R9[1],
                      in_stack_00000008,in_stack_00000018,(cl_int *)&stack0xffffffffffffffb4);
    }
    else {
      pcVar1 = dispatch(in_RDI);
      commandQueue_00 =
           (*pcVar1->clCreateImage3D)
                     (local_58,10,(cl_image_format *)&stack0xffffffffffffff94,*in_R9,in_R9[1],
                      in_R9[2],in_stack_00000008,in_stack_00000010,in_stack_00000018,
                      (cl_int *)&stack0xffffffffffffffb4);
    }
  }
  memset(&local_98,0,0x18);
  if (cVar3 == 0) {
    cVar3 = CopyImageHelper(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            (cl_command_queue)commandQueue_00,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            (size_t *)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
                            (cl_uint)in_R9,in_R8,
                            (cl_event *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0));
  }
  if (cVar3 == 0) {
    pcVar1 = dispatch(in_RDI);
    pvVar2 = (*pcVar1->clEnqueueMapImage)
                       (in_RSI,commandQueue_00,in_ECX,1,&local_98,in_R9,&stack0x00000008,
                        &stack0x00000010,0,(cl_event *)0x0,(cl_event *)0x0,
                        (cl_int *)&stack0xffffffffffffffb4);
    if (cVar3 == 0) {
      pcVar1 = dispatch(in_RDI);
      cVar3 = (*pcVar1->clEnqueueUnmapMemObject)
                        (in_RSI,commandQueue_00,pvVar2,0,(cl_event *)0x0,(cl_event *)0x0);
    }
  }
  pcVar1 = dispatch(in_RDI);
  (*pcVar1->clReleaseMemObject)(commandQueue_00);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21dbd9);
  return cVar3;
}

Assistant:

cl_int CLIntercept::ReadImage(
    cl_command_queue commandQueue,
    cl_mem srcImage,
    cl_bool blockingRead,
    const size_t* srcOrigin,
    const size_t* region,
    size_t dstRowPitch,
    size_t dstSlicePitch,
    void* dstPtr,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    // Basic error checking, to avoid possible null pointer dereferences.
    if( errorCode == CL_SUCCESS )
    {
        if( srcOrigin == NULL || region == NULL )
        {
            errorCode = CL_INVALID_VALUE;
        }
    }

    cl_context  context = NULL;

    // Get the context for this command queue.
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetCommandQueueInfo(
            commandQueue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );
    }

    // Create a USE_HOST_PTR image for the passed-in pointer.
    // The size of the buffer will be at least as big as the region to read.

    // We need to know what type of image to create.
    // If region[2] is 1, then a 2D image will suffice,
    // otherwise we'll need to create a 3D image.

    // The image will have the same image format as srcImage.

    cl_image_format srcFormat = { 0 };

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetImageInfo(
            srcImage,
            CL_IMAGE_FORMAT,
            sizeof( srcFormat ),
            &srcFormat,
            NULL );
    }

    cl_mem  dstImage = NULL;

    if( errorCode == CL_SUCCESS )
    {
        if( region[2] == 1 )
        {
            // 2D image
            dstImage = dispatch().clCreateImage2D(
                context,
                CL_MEM_USE_HOST_PTR | CL_MEM_WRITE_ONLY,
                &srcFormat,
                region[0],
                region[1],
                dstRowPitch,
                dstPtr,
                &errorCode );
        }
        else
        {
            // 3D image
            dstImage = dispatch().clCreateImage3D(
                context,
                CL_MEM_USE_HOST_PTR | CL_MEM_WRITE_ONLY,
                &srcFormat,
                region[0],
                region[1],
                region[2],
                dstRowPitch,
                dstSlicePitch,
                dstPtr,
                &errorCode );
        }
    }

    size_t  dstOrigin[3] = { 0, 0, 0 };

    if( errorCode == CL_SUCCESS )
    {
        errorCode = CopyImageHelper(
            context,
            commandQueue,
            srcImage,
            dstImage,
            srcOrigin,
            dstOrigin,
            region,
            numEventsInWaitList,
            eventWaitList,
            event );
    }

    // Technically, we need to map and unmap the destination image
    // to transfer data to our pointer.  This will also handle
    // blockingRead.
    if( errorCode == CL_SUCCESS )
    {
        void* mappedPointer = dispatch().clEnqueueMapImage(
            commandQueue,
            dstImage,
            blockingRead,
            CL_MAP_READ,
            dstOrigin,
            region,
            &dstRowPitch,
            &dstSlicePitch,
            0,
            NULL,
            NULL,
            &errorCode );

        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clEnqueueUnmapMemObject(
                commandQueue,
                dstImage,
                mappedPointer,
                0,
                NULL,
                NULL );
        }
    }

    dispatch().clReleaseMemObject( dstImage );

    return errorCode;
}